

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fInstancedRenderingTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::InstancedRenderingCase::pushVarCompAttrib
          (InstancedRenderingCase *this,
          vector<deqp::gles3::Functional::vcns::VarComp,_std::allocator<deqp::gles3::Functional::vcns::VarComp>_>
          *vec,float val)

{
  DataType DVar1;
  VarComp *__args;
  VarComp local_c;
  VarComp local_8;
  VarComp local_4;
  
  DVar1 = this->m_rgbAttrType;
  if (DVar1 - TYPE_FLOAT < 0xd || DVar1 - TYPE_DOUBLE_MAT2 < 9) {
    __args = &local_4;
    local_4.f32 = val;
  }
  else if (DVar1 - TYPE_INT < 4) {
    local_8.u32 = (deUint32)(val * 100.0 + -50.0);
    __args = &local_8;
  }
  else {
    if (3 < DVar1 - TYPE_UINT) {
      return;
    }
    __args = &local_c;
    local_c.u32 = (deUint32)(long)(val * 100.0 + 0.0);
  }
  std::
  vector<deqp::gles3::Functional::vcns::VarComp,_std::allocator<deqp::gles3::Functional::vcns::VarComp>_>
  ::emplace_back<deqp::gles3::Functional::vcns::VarComp>(vec,__args);
  return;
}

Assistant:

void InstancedRenderingCase::pushVarCompAttrib (vector<VarComp>& vec, float val)
{
	bool	isFloatCase	= glu::isDataTypeFloatOrVec(m_rgbAttrType);
	bool	isIntCase	= glu::isDataTypeIntOrIVec(m_rgbAttrType);
	bool	isUintCase	= glu::isDataTypeUintOrUVec(m_rgbAttrType);
	bool	isMatCase	= glu::isDataTypeMatrix(m_rgbAttrType);

	if (isFloatCase || isMatCase)
		vec.push_back(VarComp(val));
	else if (isIntCase)
		vec.push_back(VarComp((deInt32)(val*FLOAT_INT_SCALE + FLOAT_INT_BIAS)));
	else if (isUintCase)
		vec.push_back(VarComp((deUint32)(val*FLOAT_UINT_SCALE + FLOAT_UINT_BIAS)));
	else
		DE_ASSERT(DE_FALSE);
}